

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

AffineSpace3fa * __thiscall
embree::HeightField::get(AffineSpace3fa *__return_storage_ptr__,HeightField *this,Vec2f *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Image *pIVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Color4 c;
  float local_38 [6];
  
  pIVar6 = (this->texture).ptr;
  uVar9 = pIVar6->width - 1;
  fVar11 = (float)uVar9 * (p->field_0).field_0.x;
  uVar10 = (ulong)fVar11;
  uVar10 = (long)(fVar11 - 9.223372e+18) & (long)uVar10 >> 0x3f | uVar10;
  if (uVar9 <= uVar10) {
    uVar10 = uVar9;
  }
  uVar8 = pIVar6->height - 1;
  fVar11 = (float)uVar8 * (p->field_0).field_0.y;
  uVar9 = (ulong)fVar11;
  uVar9 = (long)(fVar11 - 9.223372e+18) & (long)uVar9 >> 0x3f | uVar9;
  if (uVar8 <= uVar9) {
    uVar9 = uVar8;
  }
  (*(pIVar6->super_RefCount)._vptr_RefCount[4])(local_38,pIVar6,uVar10,uVar9);
  fVar11 = (this->bounds).upper.field_0.m128[0];
  fVar1 = (this->bounds).lower.field_0.m128[0];
  fVar2 = (p->field_0).field_0.x;
  uVar4 = *(undefined8 *)((long)&(this->bounds).upper.field_0 + 4);
  uVar5 = *(undefined8 *)((long)&(this->bounds).lower.field_0 + 4);
  fVar12 = (float)uVar5;
  fVar13 = (float)((ulong)uVar5 >> 0x20);
  fVar3 = (p->field_0).field_0.y;
  *(undefined8 *)&(__return_storage_ptr__->l).vx.field_0 = 0x3f800000;
  *(undefined8 *)((long)&(__return_storage_ptr__->l).vx.field_0 + 8) = 0;
  *(undefined8 *)&(__return_storage_ptr__->l).vy.field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = 0;
  *(undefined8 *)&(__return_storage_ptr__->l).vz.field_0 = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = 0x3f800000;
  aVar7.m128[1] = local_38[0] * ((float)uVar4 - fVar12) + fVar12;
  aVar7.m128[0] = (fVar11 - fVar1) * fVar2 + fVar1;
  aVar7.m128[2] = fVar3 * ((float)((ulong)uVar4 >> 0x20) - fVar13) + fVar13;
  aVar7.m128[3] = 0.0;
  (__return_storage_ptr__->p).field_0 = aVar7;
  return __return_storage_ptr__;
}

Assistant:

const AffineSpace3fa get(Vec2f p)
    {
      const size_t width  = texture->width;
      const size_t height = texture->height;
      const size_t x = clamp((size_t)(p.x*(width-1)),(size_t)0,width-1);
      const size_t y = clamp((size_t)(p.y*(height-1)),(size_t)0,height-1);
      const Color4 c = texture->get(x,y);
      const float px = p.x*(bounds.upper.x-bounds.lower.x) + bounds.lower.x;
      const float py = c.r*(bounds.upper.y-bounds.lower.y) + bounds.lower.y;
      const float pz = p.y*(bounds.upper.z-bounds.lower.z) + bounds.lower.z;
      return AffineSpace3fa::translate(Vec3fa(px,py,pz));
    }